

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O1

UnifiedCache * icu_63::UnifiedCache::getInstance(UErrorCode *status)

{
  UBool UVar1;
  UnifiedCache *pUVar2;
  code *size;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((gCacheInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
       (UVar1 = umtx_initImplPreInit(&gCacheInitOnce), UVar1 == '\0')) {
      if (U_ZERO_ERROR < gCacheInitOnce.fErrCode) {
        *status = gCacheInitOnce.fErrCode;
      }
    }
    else {
      size = unifiedcache_cleanup;
      ucln_common_registerCleanup_63(UCLN_COMMON_UNIFIED_CACHE,unifiedcache_cleanup);
      pUVar2 = (UnifiedCache *)UMemory::operator_new((UMemory *)0x38,(size_t)size);
      if (pUVar2 == (UnifiedCache *)0x0) {
        pUVar2 = (UnifiedCache *)0x0;
      }
      else {
        UnifiedCache(pUVar2,status);
      }
      gCache = pUVar2;
      if (pUVar2 == (UnifiedCache *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      if (U_ZERO_ERROR < *status) {
        if (pUVar2 != (UnifiedCache *)0x0) {
          (*(pUVar2->super_UnifiedCacheBase).super_UObject._vptr_UObject[1])(pUVar2);
        }
        gCache = (UnifiedCache *)0x0;
      }
      gCacheInitOnce.fErrCode = *status;
      umtx_initImplPostInit(&gCacheInitOnce);
    }
  }
  pUVar2 = gCache;
  if (U_ZERO_ERROR < *status) {
    pUVar2 = (UnifiedCache *)0x0;
  }
  return pUVar2;
}

Assistant:

UnifiedCache *UnifiedCache::getInstance(UErrorCode &status) {
    umtx_initOnce(gCacheInitOnce, &cacheInit, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    U_ASSERT(gCache != NULL);
    return gCache;
}